

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O2

int X509_check_purpose(X509 *x,int id,int ca)

{
  int iVar1;
  X509_PURPOSE *pXVar2;
  int iVar3;
  
  iVar1 = x509v3_cache_extensions((X509 *)x);
  iVar3 = 0;
  if (iVar1 != 0) {
    if (id == -1) {
      iVar3 = 1;
    }
    else {
      pXVar2 = X509_PURPOSE_get0(id);
      if (pXVar2 != (X509_PURPOSE *)0x0) {
        if ((id != 7 && ca != 0) && (iVar1 = check_ca((X509 *)x), iVar1 == 0)) {
          return 0;
        }
        iVar1 = (**(code **)&pXVar2->flags)(pXVar2,x,ca);
        return iVar1;
      }
    }
  }
  return iVar3;
}

Assistant:

int X509_check_purpose(X509 *x, int id, int ca) {
  // This differs from OpenSSL, which uses -1 to indicate a fatal error and 0 to
  // indicate an invalid certificate. BoringSSL uses 0 for both.
  if (!x509v3_cache_extensions(x)) {
    return 0;
  }

  if (id == -1) {
    return 1;
  }
  const X509_PURPOSE *pt = X509_PURPOSE_get0(id);
  if (pt == NULL) {
    return 0;
  }
  // Historically, |check_purpose| implementations other than |X509_PURPOSE_ANY|
  // called |check_ca|. This is redundant with the |X509_V_ERR_INVALID_CA|
  // logic, but |X509_check_purpose| is public API, so we preserve this
  // behavior.
  if (ca && id != X509_PURPOSE_ANY && !check_ca(x)) {
    return 0;
  }
  return pt->check_purpose(pt, x, ca);
}